

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyImplementations.h
# Opt level: O1

void __thiscall iDynTree::DummyEnvironment::~DummyEnvironment(DummyEnvironment *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_IEnvironment)._vptr_IEnvironment = (_func_int **)&PTR__DummyEnvironment_0010c960;
  (this->m_dummyLight).super_ILight._vptr_ILight = (_func_int **)&PTR__DummyLight_0010c9f0;
  pcVar1 = (this->m_dummyLight).dummyName._M_dataplus._M_p;
  paVar2 = &(this->m_dummyLight).dummyName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~DummyEnvironment() {}